

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O1

void d68040_move16_pi_pi(m68k_info *info)

{
  ulong uVar1;
  int data [2];
  int modes [2];
  uint local_10;
  uint local_c;
  int local_8 [2];
  
  local_10 = info->ir & 7;
  uVar1 = (ulong)(info->pc - (int)info->baseAddress & info->address_mask);
  local_c = 2;
  if (uVar1 + 2 <= info->code_len) {
    local_c = info->code[uVar1] >> 4 & 7;
  }
  info->pc = info->pc + 2;
  local_8[0] = 4;
  local_8[1] = 4;
  if ((info->type & 0x10) == 0) {
    build_imm(info,0,info->ir);
    return;
  }
  build_move16(info,(int *)&local_10,local_8);
  return;
}

Assistant:

static void d68040_move16_pi_pi(m68k_info *info)
{
	int data[] = { info->ir & 7, (read_imm_16(info) >> 12) & 7 };
	int modes[] = { M68K_AM_REGI_ADDR_POST_INC, M68K_AM_REGI_ADDR_POST_INC };

	LIMIT_CPU_TYPES(info, M68040_PLUS);

	build_move16(info, data, modes);
}